

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

BrotliDecoderState *
BrotliDecoderCreateInstance(brotli_alloc_func alloc_func,brotli_free_func free_func,void *opaque)

{
  int iVar1;
  BrotliDecoderStateInternal *s;
  
  if (alloc_func == (brotli_alloc_func)0x0 && free_func == (brotli_free_func)0x0) {
    s = (BrotliDecoderStateInternal *)malloc(0x1420);
  }
  else {
    if (alloc_func == (brotli_alloc_func)0x0 || free_func == (brotli_free_func)0x0) {
      return (BrotliDecoderState *)0x0;
    }
    s = (BrotliDecoderStateInternal *)(*alloc_func)(opaque,0x1420);
  }
  if (s != (BrotliDecoderStateInternal *)0x0) {
    iVar1 = BrotliDecoderStateInit(s,alloc_func,free_func,opaque);
    if (iVar1 != 0) {
      return s;
    }
    if (alloc_func == (brotli_alloc_func)0x0 && free_func == (brotli_free_func)0x0) {
      free(s);
    }
    else if (alloc_func != (brotli_alloc_func)0x0 && free_func != (brotli_free_func)0x0) {
      (*free_func)(opaque,s);
    }
  }
  return (BrotliDecoderState *)0x0;
}

Assistant:

BrotliDecoderState* BrotliDecoderCreateInstance(
    brotli_alloc_func alloc_func, brotli_free_func free_func, void* opaque) {
  BrotliDecoderState* state = 0;
  if (!alloc_func && !free_func) {
    state = (BrotliDecoderState*)malloc(sizeof(BrotliDecoderState));
  } else if (alloc_func && free_func) {
    state = (BrotliDecoderState*)alloc_func(opaque, sizeof(BrotliDecoderState));
  }
  if (state == 0) {
    BROTLI_DUMP();
    return 0;
  }
  if (!BrotliDecoderStateInit(state, alloc_func, free_func, opaque)) {
    BROTLI_DUMP();
    if (!alloc_func && !free_func) {
      free(state);
    } else if (alloc_func && free_func) {
      free_func(opaque, state);
    }
    return 0;
  }
  return state;
}